

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.h
# Opt level: O0

void __thiscall Group::~Group(Group *this)

{
  Group *this_local;
  
  (this->super_Object3D)._vptr_Object3D = (_func_int **)&PTR__Group_001709a0;
  std::vector<Object3D_*,_std::allocator<Object3D_*>_>::~vector(&this->m_members);
  Object3D::~Object3D(&this->super_Object3D);
  return;
}

Assistant:

virtual ~Group() {}